

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  u8 uVar1;
  byte bVar2;
  bool bVar3;
  u32 uVar4;
  uint uVar5;
  int iVar6;
  u32 uVar7;
  bool bVar8;
  byte *pbVar9;
  u32 uVar11;
  u8 *puVar12;
  bool bVar13;
  byte *local_60;
  u8 *zPattern_local;
  uint local_4c;
  compareInfo *local_48;
  uint local_40;
  uint local_3c;
  u8 *local_38;
  byte *pbVar10;
  
  local_40 = (uint)pInfo->matchOne;
  local_3c = (uint)pInfo->matchAll;
  uVar1 = pInfo->noCase;
  local_38 = (u8 *)0x0;
  local_60 = zString;
  zPattern_local = zPattern;
  local_4c = matchOther;
  local_48 = pInfo;
LAB_0011bb5c:
  do {
    uVar11 = (u32)(char)*zPattern_local;
    if ((char)*zPattern_local < '\0') {
      uVar11 = sqlite3Utf8Read(&zPattern_local);
    }
    else {
      zPattern_local = zPattern_local + 1;
    }
    uVar5 = local_40;
    if (uVar11 == 0) {
      return (uint)(*local_60 != 0);
    }
    if (uVar11 == local_3c) {
      while( true ) {
        uVar11 = (u32)(char)*zPattern_local;
        if ((char)*zPattern_local < '\0') {
          uVar11 = sqlite3Utf8Read(&zPattern_local);
        }
        else {
          zPattern_local = zPattern_local + 1;
        }
        if (uVar11 != uVar5 && uVar11 != local_3c) break;
        if ((uVar11 == uVar5) && (uVar11 = sqlite3Utf8Read(&local_60), uVar11 == 0)) {
          return 2;
        }
      }
      if (uVar11 == 0) {
        return 0;
      }
      if (uVar11 == local_4c) {
        if (local_48->matchSet != '\0') {
          puVar12 = zPattern_local + -1;
          pbVar10 = local_60;
          while( true ) {
            pbVar9 = pbVar10;
            bVar2 = *pbVar9;
            if (bVar2 == 0) {
              return 2;
            }
            iVar6 = patternCompare(puVar12,pbVar9,local_48,local_4c);
            if (iVar6 != 1) break;
            pbVar10 = pbVar9 + 1;
            if (0xbf < bVar2) {
              pbVar10 = pbVar9 + 1;
            }
          }
          return iVar6;
        }
        uVar11 = sqlite3Utf8Read(&zPattern_local);
        if (uVar11 == 0) {
          return 2;
        }
      }
      puVar12 = zPattern_local;
      if (uVar11 < 0x81) {
        pbVar10 = local_60;
        uVar5 = uVar11;
        if (uVar1 != '\0') {
          uVar5 = uVar11 & (int)(char)(~""[uVar11] | 0xdf);
          uVar11 = (u32)""[uVar11];
        }
        do {
          pbVar9 = pbVar10 + 1;
          bVar2 = *pbVar10;
          if (bVar2 == 0) {
            return 2;
          }
          pbVar10 = pbVar9;
        } while (((uVar11 != bVar2) && (uVar5 != bVar2)) ||
                (iVar6 = patternCompare(puVar12,pbVar9,local_48,local_4c), iVar6 == 1));
        return iVar6;
      }
      while( true ) {
        uVar7 = (u32)(char)*local_60;
        if ((char)*local_60 < '\0') {
          uVar7 = sqlite3Utf8Read(&local_60);
        }
        else {
          local_60 = local_60 + 1;
        }
        if (uVar7 == 0) break;
        if ((uVar7 == uVar11) &&
           (iVar6 = patternCompare(puVar12,local_60,local_48,local_4c), iVar6 != 1)) {
          return iVar6;
        }
      }
      return 2;
    }
    if (uVar11 == local_4c) {
      if (local_48->matchSet != '\0') {
        uVar11 = sqlite3Utf8Read(&local_60);
        if (uVar11 == 0) {
          return 1;
        }
        uVar4 = sqlite3Utf8Read(&zPattern_local);
        uVar7 = 0;
        bVar13 = uVar4 == 0x5e;
        if (bVar13) {
          uVar4 = sqlite3Utf8Read(&zPattern_local);
        }
        bVar8 = false;
        if (uVar4 != 0x5d) goto LAB_0011bca4;
        bVar8 = uVar11 == 0x5d;
LAB_0011bc98:
        uVar7 = 0;
LAB_0011bc9a:
        uVar4 = sqlite3Utf8Read(&zPattern_local);
LAB_0011bca4:
        if (uVar4 == 0x2d) {
          if ((*zPattern_local != ']') && (uVar7 != 0 && *zPattern_local != '\0')) break;
        }
        else {
          if (uVar4 == 0x5d) {
            if (bVar8 == bVar13) {
              return 1;
            }
            goto LAB_0011bb5c;
          }
          if (uVar4 == 0) {
            return 1;
          }
        }
        uVar7 = uVar4;
        if (uVar11 == uVar4) {
          bVar8 = true;
        }
        goto LAB_0011bc9a;
      }
      uVar11 = sqlite3Utf8Read(&zPattern_local);
      if (uVar11 == 0) {
        return 1;
      }
      local_38 = zPattern_local;
    }
    uVar5 = (uint)(char)*local_60;
    if ((char)*local_60 < '\0') {
      uVar5 = sqlite3Utf8Read(&local_60);
    }
    else {
      local_60 = local_60 + 1;
    }
    if ((uVar11 != uVar5) &&
       (((uVar1 == '\0' || (0x7f < (uVar5 | uVar11))) || (""[uVar11 & 0xff] != ""[uVar5 & 0xff]))))
    {
      if (uVar11 != local_40) {
        return 1;
      }
      if (uVar5 == 0) {
        return 1;
      }
      if (zPattern_local == local_38) {
        return 1;
      }
    }
  } while( true );
  uVar4 = sqlite3Utf8Read(&zPattern_local);
  bVar3 = true;
  if (uVar4 < uVar11) {
    bVar3 = bVar8;
  }
  if (uVar7 <= uVar11) {
    bVar8 = bVar3;
  }
  goto LAB_0011bc98;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */
  
  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll || c == matchOne ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<=0x80 ){
        u32 cx;
        int bMatch;
        if( noCase ){
          cx = sqlite3Toupper(c);
          c = sqlite3Tolower(c);
        }else{
          cx = c;
        }
        while( (c2 = *(zString++))!=0 ){
          if( c2!=c && c2!=cx ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}